

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ForeachLoopStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ForeachLoopStatement,slang::ast::Expression_const&,std::span<slang::ast::ForeachLoopStatement::LoopDim,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,
          span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *args_1,
          Statement *args_2,SourceRange *args_3)

{
  pointer pLVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  ForeachLoopStatement *pFVar5;
  
  pFVar5 = (ForeachLoopStatement *)allocate(this,0x40,8);
  pLVar1 = args_1->_M_ptr;
  sVar2 = (args_1->_M_extent)._M_extent_value;
  SVar3 = args_3->startLoc;
  SVar4 = args_3->endLoc;
  (pFVar5->super_Statement).kind = ForeachLoop;
  (pFVar5->super_Statement).syntax = (StatementSyntax *)0x0;
  (pFVar5->super_Statement).sourceRange.startLoc = SVar3;
  (pFVar5->super_Statement).sourceRange.endLoc = SVar4;
  pFVar5->arrayRef = args;
  (pFVar5->loopDims)._M_ptr = pLVar1;
  (pFVar5->loopDims)._M_extent._M_extent_value = sVar2;
  pFVar5->body = args_2;
  return pFVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }